

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O1

void __thiscall
Assimp::Discreet3DSImporter::ParseChunk(Discreet3DSImporter *this,char *name,uint num)

{
  pointer *pppaVar1;
  pointer *pppaVar2;
  StreamReader<false,_false> *this_00;
  Scene *pSVar3;
  iterator __position;
  iterator __position_00;
  undefined8 uVar4;
  undefined8 uVar5;
  uint _limit;
  aiLight *paVar6;
  Logger *this_01;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  aiLight *light;
  Chunk chunk;
  undefined1 local_168 [34];
  Chunk local_146;
  char *local_140;
  char *local_138;
  float local_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined1 local_108 [24];
  pointer local_f0;
  pointer local_e0;
  pointer local_d8;
  pointer local_c8;
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  pointer local_a0;
  pointer local_90;
  pointer local_88;
  pointer local_78;
  
  if (5 < (uint)(*(int *)&this->stream->limit - *(int *)&this->stream->current)) {
    local_138 = name + num;
    local_140 = name;
    do {
      ReadChunk(this,&local_146);
      if (0 < (int)(local_146.Size - 6)) {
        this_00 = this->stream;
        _limit = StreamReader<false,_false>::SetReadLimit
                           (this_00,(local_146.Size - 6) +
                                    (*(int *)&this_00->current - *(int *)&this_00->buffer));
        if (local_146.Flag == 0x4700) {
          paVar6 = (aiLight *)operator_new(0x438);
          (paVar6->mName).length = 0;
          (paVar6->mName).data[0] = '\0';
          memset((paVar6->mName).data + 1,0x1b,0x3ff);
          paVar6->mType = aiLightSource_UNDEFINED;
          (paVar6->mPosition).x = 0.0;
          (paVar6->mPosition).y = 0.0;
          (paVar6->mPosition).z = 0.0;
          (paVar6->mDirection).x = 1.0;
          (paVar6->mDirection).y = 0.0;
          *(undefined8 *)&(paVar6->mDirection).z = 0;
          (paVar6->mUp).y = 1.0;
          (paVar6->mUp).z = 0.7853982;
          paVar6->mAttenuationConstant = 0.1;
          paVar6->mAttenuationLinear = 1000.0;
          paVar6->mAttenuationQuadratic = 0.0;
          pSVar3 = this->mScene;
          __position_00._M_current =
               (pSVar3->mCameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          local_168._0_8_ = paVar6;
          if (__position_00._M_current ==
              (pSVar3->mCameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiCamera*,std::allocator<aiCamera*>>::_M_realloc_insert<aiCamera*const&>
                      ((vector<aiCamera*,std::allocator<aiCamera*>> *)&pSVar3->mCameras,
                       __position_00,(aiCamera **)local_168);
          }
          else {
            *__position_00._M_current = (aiCamera *)paVar6;
            pppaVar2 = &(pSVar3->mCameras).
                        super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppaVar2 = *pppaVar2 + 1;
          }
          uVar4 = local_168._0_8_;
          local_108._0_8_ = local_108 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_108,local_140,local_138);
          uVar5 = local_108._8_8_;
          if ((ulong)local_108._8_8_ < (pointer)0x400) {
            *(int *)uVar4 = (int)local_108._8_8_;
            memcpy((char *)(uVar4 + 4),(void *)local_108._0_8_,local_108._8_8_);
            ((char *)(uVar4 + 4))[uVar5] = '\0';
          }
          if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
            operator_delete((void *)local_108._0_8_,(ulong)((long)(float *)local_108._16_8_ + 1));
          }
          fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
          *(float *)(local_168._0_8_ + 0x404) = fVar8;
          fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
          ((aiVector3D *)(local_168._0_8_ + 0x408))->x = fVar8;
          fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
          *(float *)(local_168._0_8_ + 0x40c) = fVar8;
          fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
          *(float *)(local_168._0_8_ + 0x41c) = fVar8 - *(float *)(local_168._0_8_ + 0x404);
          fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
          ((aiVector3D *)(local_168._0_8_ + 0x420))->x =
               fVar8 - ((aiVector3D *)(local_168._0_8_ + 0x408))->x;
          fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
          fVar8 = fVar8 - *(float *)(local_168._0_8_ + 0x40c);
          *(float *)(local_168._0_8_ + 0x424) = fVar8;
          fVar8 = fVar8 * fVar8 +
                  *(float *)(local_168._0_8_ + 0x41c) * *(float *)(local_168._0_8_ + 0x41c) +
                  ((aiVector3D *)(local_168._0_8_ + 0x420))->x *
                  ((aiVector3D *)(local_168._0_8_ + 0x420))->x;
          if (fVar8 < 0.0) {
            fVar8 = sqrtf(fVar8);
          }
          else {
            fVar8 = SQRT(fVar8);
          }
          if (1e-05 <= fVar8) {
            fVar8 = 1.0 / fVar8;
            *(float *)(local_168._0_8_ + 0x41c) = *(float *)(local_168._0_8_ + 0x41c) * fVar8;
            ((aiVector3D *)(local_168._0_8_ + 0x420))->x =
                 ((aiVector3D *)(local_168._0_8_ + 0x420))->x * fVar8;
            *(float *)(local_168._0_8_ + 0x424) = fVar8 * *(float *)(local_168._0_8_ + 0x424);
          }
          else {
            this_01 = DefaultLogger::get();
            Logger::error(this_01,"3DS: Unable to read proper camera look-at vector");
            *(undefined8 *)(local_168._0_8_ + 0x41c) = 0x3f80000000000000;
            *(float *)(local_168._0_8_ + 0x424) = 0.0;
          }
          fVar9 = StreamReader<false,_false>::Get<float>(this->stream);
          local_118 = *(undefined8 *)(local_168._0_8_ + 0x41c);
          fVar8 = *(float *)(local_168._0_8_ + 0x424);
          local_128 = (float)((ulong)local_118 >> 0x20);
          uStack_110 = 0;
          fVar10 = fVar8 * fVar8 + (float)local_118 * (float)local_118 + local_128 * local_128;
          fStack_124 = local_128;
          fStack_120 = local_128;
          fStack_11c = local_128;
          if (fVar10 < 0.0) {
            fVar10 = sqrtf(fVar10);
          }
          else {
            fVar10 = SQRT(fVar10);
          }
          fVar10 = 1.0 / fVar10;
          local_118 = CONCAT44(local_118._4_4_,(float)local_118 * fVar10);
          local_128 = local_128 * fVar10;
          fVar9 = fVar9 * 0.017453292 * 0.5;
          local_12c = sinf(fVar9);
          fVar9 = cosf(fVar9);
          fVar12 = (float)local_118 * local_12c;
          fVar11 = local_128 * local_12c;
          fVar18 = fVar8 * fVar10 * local_12c;
          fVar8 = fVar11 * fVar11 + fVar18 * fVar18;
          fVar15 = fVar12 * fVar11 - fVar9 * fVar18;
          fVar10 = fVar12 * fVar18 + fVar9 * fVar11;
          fVar14 = fVar9 * fVar18 + fVar12 * fVar11;
          fVar16 = fVar18 * fVar18 + fVar12 * fVar12;
          fVar17 = fVar18 * fVar11 - fVar9 * fVar12;
          fVar13 = fVar12 * fVar18 - fVar9 * fVar11;
          fVar9 = fVar18 * fVar11 + fVar9 * fVar12;
          fVar11 = fVar12 * fVar12 + fVar11 * fVar11;
          *(ulong *)(local_168._0_8_ + 0x410) =
               CONCAT44((fVar17 + fVar17) * 0.0 +
                        (fVar14 + fVar14) * 0.0 + (1.0 - (fVar16 + fVar16)),
                        (fVar10 + fVar10) * 0.0 + (1.0 - (fVar8 + fVar8)) * 0.0 + fVar15 + fVar15);
          *(float *)(local_168._0_8_ + 0x418) =
               (1.0 - (fVar11 + fVar11)) * 0.0 + (fVar13 + fVar13) * 0.0 + fVar9 + fVar9;
          fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
          uVar7 = -(uint)(fVar8 * 0.017453292 < 0.001);
          *(uint *)(local_168._0_8_ + 0x428) =
               ~uVar7 & (uint)(fVar8 * 0.017453292) | uVar7 & 0x3f490fdb;
          if (this->bIsPrj == false) {
            ParseCameraChunk(this);
          }
        }
        else if (local_146.Flag == 0x4600) {
          paVar6 = (aiLight *)operator_new(0x46c);
          (paVar6->mName).length = 0;
          (paVar6->mName).data[0] = '\0';
          memset((paVar6->mName).data + 1,0x1b,0x3ff);
          paVar6->mType = aiLightSource_UNDEFINED;
          (paVar6->mPosition).x = 0.0;
          (paVar6->mPosition).y = 0.0;
          (paVar6->mPosition).z = 0.0;
          (paVar6->mDirection).x = 0.0;
          (paVar6->mDirection).y = 0.0;
          *(undefined8 *)&(paVar6->mDirection).z = 0;
          (paVar6->mUp).x = 0.0;
          (paVar6->mUp).y = 0.0;
          *(undefined8 *)&(paVar6->mUp).z = 0;
          paVar6->mAttenuationLinear = 1.0;
          paVar6->mAttenuationQuadratic = 0.0;
          (paVar6->mColorDiffuse).r = 0.0;
          (paVar6->mColorDiffuse).g = 0.0;
          (paVar6->mColorDiffuse).b = 0.0;
          (paVar6->mColorSpecular).r = 0.0;
          (paVar6->mColorSpecular).g = 0.0;
          *(undefined8 *)&(paVar6->mColorSpecular).b = 0;
          (paVar6->mColorAmbient).g = 0.0;
          (paVar6->mColorAmbient).b = 0.0;
          paVar6->mAngleInnerCone = 6.2831855;
          paVar6->mAngleOuterCone = 6.2831855;
          (paVar6->mSize).x = 0.0;
          (paVar6->mSize).y = 0.0;
          pSVar3 = this->mScene;
          __position._M_current =
               (pSVar3->mLights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_168._0_8_ = paVar6;
          if (__position._M_current ==
              (pSVar3->mLights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiLight*,std::allocator<aiLight*>>::_M_realloc_insert<aiLight*const&>
                      ((vector<aiLight*,std::allocator<aiLight*>> *)&pSVar3->mLights,__position,
                       (aiLight **)local_168);
          }
          else {
            *__position._M_current = paVar6;
            pppaVar1 = &(pSVar3->mLights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            *pppaVar1 = *pppaVar1 + 1;
          }
          uVar4 = local_168._0_8_;
          local_108._0_8_ = local_108 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_108,local_140,local_138);
          uVar5 = local_108._8_8_;
          if ((ulong)local_108._8_8_ < (pointer)0x400) {
            *(int *)uVar4 = (int)local_108._8_8_;
            memcpy((char *)(uVar4 + 4),(void *)local_108._0_8_,local_108._8_8_);
            ((char *)(uVar4 + 4))[uVar5] = '\0';
          }
          if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
            operator_delete((void *)local_108._0_8_,(ulong)((long)(float *)local_108._16_8_ + 1));
          }
          fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
          ((aiVector3D *)(local_168._0_8_ + 0x408))->x = fVar8;
          fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
          *(float *)(local_168._0_8_ + 0x40c) = fVar8;
          fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
          *(float *)(local_168._0_8_ + 0x410) = fVar8;
          ((aiColor3D *)(local_168._0_8_ + 0x438))->r = 1.0;
          ((aiColor3D *)(local_168._0_8_ + 0x438))->g = 1.0;
          *(ai_real *)(local_168._0_8_ + 0x440) = 1.0;
          if (this->bIsPrj == false) {
            ParseLightChunk(this);
          }
          ((aiColor3D *)(local_168._0_8_ + 0x444))->r = ((aiColor3D *)(local_168._0_8_ + 0x438))->r;
          *(undefined8 *)(local_168._0_8_ + 0x448) = *(undefined8 *)(local_168._0_8_ + 0x43c);
          ((aiColor3D *)(local_168._0_8_ + 0x450))->r = (this->mClrAmbient).r;
          *(ai_real *)(local_168._0_8_ + 0x454) = (this->mClrAmbient).g;
          *(ai_real *)(local_168._0_8_ + 0x458) = (this->mClrAmbient).b;
          if (*(aiLightSourceType *)(local_168._0_8_ + 0x404) == aiLightSource_UNDEFINED) {
            *(aiLightSourceType *)(local_168._0_8_ + 0x404) = aiLightSource_POINT;
          }
        }
        else if (local_146.Flag == 0x4100) {
          pSVar3 = this->mScene;
          local_168._0_8_ = local_168 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_168,local_140,local_138);
          D3DS::Mesh::Mesh((Mesh *)local_108,(string *)local_168);
          std::vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>::
          emplace_back<Assimp::D3DS::Mesh>(&pSVar3->mMeshes,(Mesh *)local_108);
          if (local_88 != (pointer)0x0) {
            operator_delete(local_88,(long)local_78 - (long)local_88);
          }
          if (local_a0 != (pointer)0x0) {
            operator_delete(local_a0,(long)local_90 - (long)local_a0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_p != &local_b0) {
            operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
          }
          if (local_d8 != (pointer)0x0) {
            operator_delete(local_d8,(long)local_c8 - (long)local_d8);
          }
          if (local_f0 != (pointer)0x0) {
            operator_delete(local_f0,(long)local_e0 - (long)local_f0);
          }
          if ((pointer)local_108._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
          }
          if ((aiLight *)local_168._0_8_ != (aiLight *)(local_168 + 0x10)) {
            operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
          }
          ParseMeshChunk(this);
        }
        this->stream->current = this->stream->limit;
        StreamReader<false,_false>::SetReadLimit(this->stream,_limit);
        if (*(int *)&this->stream->limit == *(int *)&this->stream->current) {
          return;
        }
      }
    } while (5 < (uint)(*(int *)&this->stream->limit - *(int *)&this->stream->current));
  }
  return;
}

Assistant:

void Discreet3DSImporter::ParseChunk(const char* name, unsigned int num)
{
    ASSIMP_3DS_BEGIN_CHUNK();

    // IMPLEMENTATION NOTE;
    // Cameras or lights define their transformation in their parent node and in the
    // corresponding light or camera chunks. However, we read and process the latter
    // to to be able to return valid cameras/lights even if no scenegraph is given.

    // get chunk type
    switch (chunk.Flag)
    {
    case Discreet3DS::CHUNK_TRIMESH:
        {
        // this starts a new triangle mesh
        mScene->mMeshes.push_back(D3DS::Mesh(std::string(name, num)));

        // Read mesh chunks
        ParseMeshChunk();
        }
        break;

    case Discreet3DS::CHUNK_LIGHT:
        {
        // This starts a new light
        aiLight* light = new aiLight();
        mScene->mLights.push_back(light);

        light->mName.Set(std::string(name, num));

        // First read the position of the light
        light->mPosition.x = stream->GetF4();
        light->mPosition.y = stream->GetF4();
        light->mPosition.z = stream->GetF4();

        light->mColorDiffuse = aiColor3D(1.f,1.f,1.f);

        // Now check for further subchunks
        if (!bIsPrj) /* fixme */
            ParseLightChunk();

        // The specular light color is identical the the diffuse light color. The ambient light color
        // is equal to the ambient base color of the whole scene.
        light->mColorSpecular = light->mColorDiffuse;
        light->mColorAmbient  = mClrAmbient;

        if (light->mType == aiLightSource_UNDEFINED)
        {
            // It must be a point light
            light->mType = aiLightSource_POINT;
        }}
        break;

    case Discreet3DS::CHUNK_CAMERA:
        {
        // This starts a new camera
        aiCamera* camera = new aiCamera();
        mScene->mCameras.push_back(camera);
        camera->mName.Set(std::string(name, num));

        // First read the position of the camera
        camera->mPosition.x = stream->GetF4();
        camera->mPosition.y = stream->GetF4();
        camera->mPosition.z = stream->GetF4();

        // Then the camera target
        camera->mLookAt.x = stream->GetF4() - camera->mPosition.x;
        camera->mLookAt.y = stream->GetF4() - camera->mPosition.y;
        camera->mLookAt.z = stream->GetF4() - camera->mPosition.z;
        ai_real len = camera->mLookAt.Length();
        if (len < 1e-5) {

            // There are some files with lookat == position. Don't know why or whether it's ok or not.
            ASSIMP_LOG_ERROR("3DS: Unable to read proper camera look-at vector");
            camera->mLookAt = aiVector3D(0.0,1.0,0.0);

        }
        else camera->mLookAt /= len;

        // And finally - the camera rotation angle, in counter clockwise direction
        const ai_real angle =  AI_DEG_TO_RAD( stream->GetF4() );
        aiQuaternion quat(camera->mLookAt,angle);
        camera->mUp = quat.GetMatrix() * aiVector3D(0.0,1.0,0.0);

        // Read the lense angle
        camera->mHorizontalFOV = AI_DEG_TO_RAD ( stream->GetF4() );
        if (camera->mHorizontalFOV < 0.001f)  {
            camera->mHorizontalFOV = AI_DEG_TO_RAD(45.f);
        }

        // Now check for further subchunks
        if (!bIsPrj) /* fixme */ {
            ParseCameraChunk();
        }}
        break;
    };
    ASSIMP_3DS_END_CHUNK();
}